

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5TrimSegments(Fts5Index *p,Fts5Iter *pIter)

{
  int iVar1;
  Fts5SegIter *pFVar2;
  long iRowid;
  bool bVar3;
  u8 local_58 [4];
  int nDiff;
  u8 aHdr [4];
  int iId;
  Fts5Data *pData;
  i64 iLeafRowid;
  int iOff;
  Fts5SegIter *pSeg;
  Fts5Buffer buf;
  int i;
  Fts5Iter *pIter_local;
  Fts5Index *p_local;
  
  memset(&pSeg,0,0x10);
  buf.nSpace = 0;
  while( true ) {
    bVar3 = false;
    if (buf.nSpace < pIter->nSeg) {
      bVar3 = p->rc == 0;
    }
    if (!bVar3) break;
    pFVar2 = pIter->aSeg + buf.nSpace;
    if (pFVar2->pSeg != (Fts5StructureSegment *)0x0) {
      if (pFVar2->pLeaf == (Fts5Data *)0x0) {
        pFVar2->pSeg->pgnoLast = 0;
        pFVar2->pSeg->pgnoFirst = 0;
      }
      else {
        iVar1 = pFVar2->iTermLeafOffset;
        nDiff = pFVar2->pSeg->iSegid;
        memset(local_58,0,4);
        iRowid = ((long)nDiff << 0x25) + (long)pFVar2->iTermLeafPgno;
        _aHdr = fts5LeafRead(p,iRowid);
        if (_aHdr != (Fts5Data *)0x0) {
          if (_aHdr->szLeaf < iVar1) {
            p->rc = 0x10b;
          }
          else {
            sqlite3Fts5BufferZero((Fts5Buffer *)&pSeg);
            if (buf.p._4_4_ < (uint)((int)buf.p + _aHdr->nn)) {
              sqlite3Fts5BufferSize(&p->rc,(Fts5Buffer *)&pSeg,_aHdr->nn + (int)buf.p);
            }
            sqlite3Fts5BufferAppendBlob(&p->rc,(Fts5Buffer *)&pSeg,4,local_58);
            sqlite3Fts5BufferAppendVarint(&p->rc,(Fts5Buffer *)&pSeg,(long)(pFVar2->term).n);
            sqlite3Fts5BufferAppendBlob
                      (&p->rc,(Fts5Buffer *)&pSeg,(pFVar2->term).n,(pFVar2->term).p);
            sqlite3Fts5BufferAppendBlob
                      (&p->rc,(Fts5Buffer *)&pSeg,_aHdr->szLeaf - iVar1,_aHdr->p + iVar1);
            if (p->rc == 0) {
              fts5PutU16((u8 *)((long)&pSeg->pSeg + 2),(u16)(int)buf.p);
            }
            sqlite3Fts5BufferAppendVarint(&p->rc,(Fts5Buffer *)&pSeg,4);
            if (((pFVar2->iLeafPgno == pFVar2->iTermLeafPgno) &&
                (pFVar2->iEndofDoclist < _aHdr->szLeaf)) && (pFVar2->iPgidxOff <= _aHdr->nn)) {
              sqlite3Fts5BufferAppendVarint
                        (&p->rc,(Fts5Buffer *)&pSeg,
                         (long)(((int)buf.p - (_aHdr->szLeaf - pFVar2->iEndofDoclist)) + -5));
              sqlite3Fts5BufferAppendBlob
                        (&p->rc,(Fts5Buffer *)&pSeg,_aHdr->nn - pFVar2->iPgidxOff,
                         _aHdr->p + pFVar2->iPgidxOff);
            }
            pFVar2->pSeg->pgnoFirst = pFVar2->iTermLeafPgno;
            fts5DataDelete(p,((long)nDiff << 0x25) + 1,iRowid);
            fts5DataWrite(p,iRowid,(u8 *)pSeg,(int)buf.p);
          }
          fts5DataRelease(_aHdr);
        }
      }
    }
    buf.nSpace = buf.nSpace + 1;
  }
  sqlite3Fts5BufferFree((Fts5Buffer *)&pSeg);
  return;
}

Assistant:

static void fts5TrimSegments(Fts5Index *p, Fts5Iter *pIter){
  int i;
  Fts5Buffer buf;
  memset(&buf, 0, sizeof(Fts5Buffer));
  for(i=0; i<pIter->nSeg && p->rc==SQLITE_OK; i++){
    Fts5SegIter *pSeg = &pIter->aSeg[i];
    if( pSeg->pSeg==0 ){
      /* no-op */
    }else if( pSeg->pLeaf==0 ){
      /* All keys from this input segment have been transfered to the output.
      ** Set both the first and last page-numbers to 0 to indicate that the
      ** segment is now empty. */
      pSeg->pSeg->pgnoLast = 0;
      pSeg->pSeg->pgnoFirst = 0;
    }else{
      int iOff = pSeg->iTermLeafOffset;     /* Offset on new first leaf page */
      i64 iLeafRowid;
      Fts5Data *pData;
      int iId = pSeg->pSeg->iSegid;
      u8 aHdr[4] = {0x00, 0x00, 0x00, 0x00};

      iLeafRowid = FTS5_SEGMENT_ROWID(iId, pSeg->iTermLeafPgno);
      pData = fts5LeafRead(p, iLeafRowid);
      if( pData ){
        if( iOff>pData->szLeaf ){
          /* This can occur if the pages that the segments occupy overlap - if
          ** a single page has been assigned to more than one segment. In
          ** this case a prior iteration of this loop may have corrupted the
          ** segment currently being trimmed.  */
          p->rc = FTS5_CORRUPT;
        }else{
          fts5BufferZero(&buf);
          fts5BufferGrow(&p->rc, &buf, pData->nn);
          fts5BufferAppendBlob(&p->rc, &buf, sizeof(aHdr), aHdr);
          fts5BufferAppendVarint(&p->rc, &buf, pSeg->term.n);
          fts5BufferAppendBlob(&p->rc, &buf, pSeg->term.n, pSeg->term.p);
          fts5BufferAppendBlob(&p->rc, &buf, pData->szLeaf-iOff,&pData->p[iOff]);
          if( p->rc==SQLITE_OK ){
            /* Set the szLeaf field */
            fts5PutU16(&buf.p[2], (u16)buf.n);
          }

          /* Set up the new page-index array */
          fts5BufferAppendVarint(&p->rc, &buf, 4);
          if( pSeg->iLeafPgno==pSeg->iTermLeafPgno 
           && pSeg->iEndofDoclist<pData->szLeaf
           && pSeg->iPgidxOff<=pData->nn
          ){
            int nDiff = pData->szLeaf - pSeg->iEndofDoclist;
            fts5BufferAppendVarint(&p->rc, &buf, buf.n - 1 - nDiff - 4);
            fts5BufferAppendBlob(&p->rc, &buf, 
                pData->nn - pSeg->iPgidxOff, &pData->p[pSeg->iPgidxOff]
            );
          }

          pSeg->pSeg->pgnoFirst = pSeg->iTermLeafPgno;
          fts5DataDelete(p, FTS5_SEGMENT_ROWID(iId, 1), iLeafRowid);
          fts5DataWrite(p, iLeafRowid, buf.p, buf.n);
        }
        fts5DataRelease(pData);
      }
    }
  }
  fts5BufferFree(&buf);
}